

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

vector<const_vkt::shaderexecutor::CaseFactory_*,_std::allocator<const_vkt::shaderexecutor::CaseFactory_*>_>
* __thiscall
vkt::shaderexecutor::BuiltinFuncs::getFactories
          (vector<const_vkt::shaderexecutor::CaseFactory_*,_std::allocator<const_vkt::shaderexecutor::CaseFactory_*>_>
           *__return_storage_ptr__,BuiltinFuncs *this)

{
  pointer pSVar1;
  long lVar2;
  ulong uVar3;
  CaseFactory *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<const_vkt::shaderexecutor::CaseFactory_*,_std::allocator<const_vkt::shaderexecutor::CaseFactory_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_vkt::shaderexecutor::CaseFactory_*,_std::allocator<const_vkt::shaderexecutor::CaseFactory_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_vkt::shaderexecutor::CaseFactory_*,_std::allocator<const_vkt::shaderexecutor::CaseFactory_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (this->m_factories).
           super__Vector_base<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>,_std::allocator<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_factories).
      super__Vector_base<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>,_std::allocator<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      local_30 = *(CaseFactory **)((long)&pSVar1->m_ptr + lVar2);
      std::
      vector<vkt::shaderexecutor::CaseFactory_const*,std::allocator<vkt::shaderexecutor::CaseFactory_const*>>
      ::emplace_back<vkt::shaderexecutor::CaseFactory_const*>
                ((vector<vkt::shaderexecutor::CaseFactory_const*,std::allocator<vkt::shaderexecutor::CaseFactory_const*>>
                  *)__return_storage_ptr__,&local_30);
      uVar3 = uVar3 + 1;
      pSVar1 = (this->m_factories).
               super__Vector_base<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>,_std::allocator<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)((long)(this->m_factories).
                                   super__Vector_base<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>,_std::allocator<de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4));
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<const CaseFactory*>		getFactories	(void) const
	{
		vector<const CaseFactory*> ret;

		for (size_t ndx = 0; ndx < m_factories.size(); ++ndx)
			ret.push_back(m_factories[ndx].get());

		return ret;
	}